

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O0

bool __thiscall
csm::ModelIdentifier::addComponent(ModelIdentifier *this,string *argName,double argValue)

{
  bool bVar1;
  Data local_70;
  undefined1 local_58 [8];
  MIComponent component;
  double argValue_local;
  string *argName_local;
  ModelIdentifier *this_local;
  
  component.second.field_1.field_0.theStr = (char *)argValue;
  MIC::Data::Data(&local_70,argValue);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::pair<csm::MIC::Data,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
              *)local_58,argName,&local_70);
  MIC::Data::~Data(&local_70);
  bVar1 = addComponent(this,(MIComponent *)local_58);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_csm::MIC::Data>
           *)local_58);
  return bVar1;
}

Assistant:

bool ModelIdentifier::addComponent(const std::string& argName,
                                   double             argValue)
{
   MIComponent component(argName,MIC::Data(argValue));
   
   return addComponent(component);
}